

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinRange
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  pointer pVVar3;
  HeapEntity *pHVar4;
  HeapThunk *pHVar5;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *args_2;
  _Link_type __x;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  long lVar6;
  _Base_ptr p_Var7;
  long lVar8;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar9;
  HeapThunk *th;
  string local_88;
  undefined1 local_60 [40];
  long local_38;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"range","");
  local_60._0_8_ = (HeapThunk *)0x200000002;
  __l._M_len = 2;
  __l._M_array = (iterator)local_60;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)(local_60 + 0x18),__l,in_RCX);
  params = (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)(local_60 + 0x18);
  args_2 = args;
  validateBuiltinArgs(this,loc,&local_88,args,params);
  if ((_Base_ptr)local_60._24_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_60._24_8_,local_38 - local_60._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pVVar3 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (_Base_ptr)(long)(pVVar3->v).d;
  dVar2 = pVVar3[1].v.d;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  VVar9 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)&local_88);
  lVar8 = (long)dVar2 - (long)p_Var7;
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar9._0_8_;
  if (local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p,
                    local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
  }
  if (-1 < lVar8) {
    pHVar4 = (this->scratch).v.h;
    local_60._8_8_ = &this->idArrayElement;
    lVar6 = -1;
    local_60._16_8_ = p_Var7;
    do {
      local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
      pHVar5 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,(Identifier **)local_60._8_8_,(void **)&local_88,
                          (int *)args_2,(void **)params);
      __x = (_Link_type)local_60;
      local_60._0_8_ = pHVar5;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(pHVar4 + 1),(value_type *)__x);
      local_88._M_dataplus._M_p =
           (pointer)(double)((long)(_Rb_tree_color *)local_60._16_8_ + lVar6 + 1);
      (pHVar5->content).t = NUMBER;
      (pHVar5->content).v.d = (double)local_88._M_dataplus._M_p;
      (pHVar5->super_HeapEntity).field_0xa = 1;
      pHVar5->self = (HeapObject *)0x0;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      p_Var1 = &(pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header;
      (pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pHVar5->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar8);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinRange(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "range", args, {Value::NUMBER, Value::NUMBER});
        long from = long(args[0].v.d);
        long to = long(args[1].v.d);
        long len = to - from + 1;
        scratch = makeArray({});
        if (len > 0) {
            auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
            for (int i = 0; i < len; ++i) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeNumber(from + i));
            }
        }
        return nullptr;
    }